

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_state.cpp
# Opt level: O1

unique_ptr<duckdb::RadixPartitionedTupleData,_std::default_delete<duckdb::RadixPartitionedTupleData>,_true>
 __thiscall
duckdb::PartitionGlobalSinkState::CreatePartition(PartitionGlobalSinkState *this,idx_t new_bits)

{
  long lVar1;
  long lVar2;
  BufferManager *buffer_manager;
  RadixPartitionedTupleData *this_00;
  idx_t in_RDX;
  shared_ptr<duckdb::TupleDataLayout,_true> local_40;
  
  lVar1 = *(long *)(new_bits + 0xa0);
  lVar2 = *(long *)(new_bits + 0x98);
  buffer_manager = *(BufferManager **)(new_bits + 0x10);
  this_00 = (RadixPartitionedTupleData *)operator_new(0x90);
  local_40.internal.super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)(new_bits + 0x50);
  local_40.internal.super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(new_bits + 0x58);
  if (local_40.internal.super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_40.internal.super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_40.internal.super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_40.internal.super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_40.internal.super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  RadixPartitionedTupleData::RadixPartitionedTupleData
            (this_00,buffer_manager,&local_40,in_RDX,(lVar1 - lVar2 >> 3) * -0x5555555555555555);
  this->_vptr_PartitionGlobalSinkState = (_func_int **)this_00;
  if (local_40.internal.super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_40.internal.
               super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return (unique_ptr<duckdb::RadixPartitionedTupleData,_std::default_delete<duckdb::RadixPartitionedTupleData>_>
          )(unique_ptr<duckdb::RadixPartitionedTupleData,_std::default_delete<duckdb::RadixPartitionedTupleData>_>
            )this;
}

Assistant:

unique_ptr<RadixPartitionedTupleData> PartitionGlobalSinkState::CreatePartition(idx_t new_bits) const {
	const auto hash_col_idx = payload_types.size();
	return make_uniq<RadixPartitionedTupleData>(buffer_manager, grouping_types_ptr, new_bits, hash_col_idx);
}